

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::newLineCheck(Output *this)

{
  SmallVector<llvm::yaml::Output::InState,_8U> *this_00;
  uint uVar1;
  bool bVar2;
  reference pIVar3;
  int iVar4;
  StringRef s;
  StringRef s_00;
  StringRef RHS;
  
  RHS.Length = 1;
  RHS.Data = "\n";
  bVar2 = llvm::operator!=(this->Padding,RHS);
  if (bVar2) {
    output(this,this->Padding);
    (this->Padding).Data = (char *)0x0;
    (this->Padding).Length = 0;
  }
  else {
    outputNewLine(this);
    (this->Padding).Data = (char *)0x0;
    (this->Padding).Length = 0;
    uVar1 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
            super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
            super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase
            .Size;
    if (uVar1 != 0) {
      this_00 = &this->StateStack;
      iVar4 = uVar1 - 1;
      pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)this_00);
      bVar2 = true;
      if ((*pIVar3 != inSeqFirstElement) &&
         (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                             ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                              this_00), *pIVar3 != inSeqOtherElement)) {
        if (((this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
             super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
             super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
             super_SmallVectorBase.Size < 2) ||
           (((pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                                 ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                                  this_00), *pIVar3 != inMapFirstKey &&
             (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                                 ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                                  this_00), (*pIVar3 & ~inSeqOtherElement) != inFlowSeqFirstElement)
             ) && (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                                      ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>
                                        *)this_00), *pIVar3 != inFlowMapFirstKey)))) {
          bVar2 = false;
        }
        else {
          pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                             ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                              this_00,(ulong)(this->StateStack).
                                             super_SmallVectorImpl<llvm::yaml::Output::InState>.
                                             super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>
                                             .
                                             super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>
                                             .super_SmallVectorBase.Size - 2);
          bVar2 = *pIVar3 < inFlowSeqFirstElement;
          if (bVar2) {
            iVar4 = uVar1 - 2;
          }
        }
      }
      while (iVar4 != 0) {
        s.Length = 2;
        s.Data = "  ";
        output(this,s);
        iVar4 = iVar4 + -1;
      }
      if (bVar2) {
        s_00.Length = 2;
        s_00.Data = "- ";
        output(this,s_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void Output::newLineCheck() {
  if (Padding != "\n") {
    output(Padding);
    Padding = {};
    return;
  }
  outputNewLine();
  Padding = {};

  if (StateStack.size() == 0)
    return;

  unsigned Indent = StateStack.size() - 1;
  bool OutputDash = false;

  if (StateStack.back() == inSeqFirstElement ||
      StateStack.back() == inSeqOtherElement) {
    OutputDash = true;
  } else if ((StateStack.size() > 1) &&
             ((StateStack.back() == inMapFirstKey) ||
              inFlowSeqAnyElement(StateStack.back()) ||
              (StateStack.back() == inFlowMapFirstKey)) &&
             inSeqAnyElement(StateStack[StateStack.size() - 2])) {
    --Indent;
    OutputDash = true;
  }

  for (unsigned i = 0; i < Indent; ++i) {
    output("  ");
  }
  if (OutputDash) {
    output("- ");
  }

}